

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

int sptk::world::anon_unknown_2::GetBoundaryList(double *f0,int f0_length,int *boundary_list)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  undefined4 *puVar3;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int i_1;
  int i;
  int *vuv;
  int number_of_boundaries;
  int local_30;
  int local_2c;
  int local_1c;
  
  local_1c = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_ESI;
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  puVar3 = (undefined4 *)operator_new__(uVar2);
  for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
    puVar3[local_2c] = (uint)(0.0 < *(double *)(in_RDI + (long)local_2c * 8));
  }
  puVar3[in_ESI + -1] = 0;
  *puVar3 = 0;
  for (local_30 = 1; local_30 < in_ESI; local_30 = local_30 + 1) {
    if (puVar3[local_30] != puVar3[local_30 + -1]) {
      *(int *)(in_RDX + (long)local_1c * 4) = local_30 - local_1c % 2;
      local_1c = local_1c + 1;
    }
  }
  if (puVar3 != (undefined4 *)0x0) {
    operator_delete__(puVar3);
  }
  return local_1c;
}

Assistant:

static int GetBoundaryList(const double *f0, int f0_length,
    int *boundary_list) {
  int number_of_boundaries = 0;
  int *vuv = new int[f0_length];
  for (int i = 0; i < f0_length; ++i)
    vuv[i] = f0[i] > 0 ? 1 : 0;
  vuv[0] = vuv[f0_length - 1] = 0;

  for (int i = 1; i < f0_length; ++i)
    if (vuv[i] - vuv[i - 1] != 0) {
      boundary_list[number_of_boundaries] = i - number_of_boundaries % 2;
      number_of_boundaries++;
    }

  delete[] vuv;
  return number_of_boundaries;
}